

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall GrcManager::DebugGlyphAttributes(GrcManager *this,char *pchOutputPath)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  char *pcVar6;
  Symbol pGVar7;
  GrcManager *this_00;
  size_type_conflict sVar8;
  reference ppGVar9;
  ostream *poVar10;
  GrcSymbolTableEntry *this_01;
  GrcSymbolTableEntry *pGVar11;
  char *in_RSI;
  long in_RDI;
  int n;
  size_t ipass;
  int tValue;
  size_t iStop;
  size_t iStart;
  int nValue;
  uint nAttrID_1;
  bool fAnyNonZero;
  uint wGlyphID;
  size_t nAttrID;
  int nAttrIdJStr;
  Symbol psymJStr;
  size_t cpass;
  Symbol psymSkipP2;
  int nAttrIdSkipP2;
  int nAttrIdSkipP;
  Symbol psymSkipP;
  int nAttrIdBw;
  Symbol psymBw;
  ofstream strmOut;
  string staOutputFilename;
  string *in_stack_fffffffffffffa68;
  GrcSymbolTableEntry *in_stack_fffffffffffffa70;
  ostream *in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa84;
  byte in_stack_fffffffffffffa85;
  undefined1 in_stack_fffffffffffffa86;
  undefined1 in_stack_fffffffffffffa87;
  GrcManager *in_stack_fffffffffffffa88;
  string *in_stack_fffffffffffffa90;
  allocator *paVar12;
  string *in_stack_fffffffffffffa98;
  GdlRenderer *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  GrcSymbolTableEntry *in_stack_fffffffffffffab8;
  GrcErrorList *in_stack_fffffffffffffac0;
  GrcStructName *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  allocator *paVar13;
  GrcManager *this_02;
  allocator *paVar14;
  GrcManager *local_448;
  uint local_43c;
  GrcManager *local_438;
  GrcManager *local_430;
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  uint local_3e0;
  uint local_3dc;
  byte local_3d5;
  uint local_3d4;
  string local_3d0 [32];
  ulong local_3b0;
  int local_3a8;
  allocator local_3a1;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [56];
  Symbol local_340;
  GrcManager *local_338;
  allocator local_329;
  string local_328 [32];
  Symbol local_308;
  uint local_2fc;
  uint local_2f8;
  allocator local_2f1;
  string local_2f0 [32];
  Symbol local_2d0;
  int local_2c8;
  allocator local_2c1;
  string local_2c0 [32];
  Symbol local_2a0;
  undefined4 local_298;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  ostream local_248;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::append((char *)local_30);
  std::ofstream::ofstream(&local_248);
  _Var4 = std::__cxx11::string::data();
  std::ofstream::open((char *)&local_248,_Var4);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"breakweight",&local_2c1);
    pGVar7 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)
                        CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                        in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    local_2a0 = pGVar7;
    local_2c8 = GrcSymbolTableEntry::InternalID(pGVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"*skipPasses*",&local_2f1);
    pGVar7 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)
                        CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                        in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    local_2d0 = pGVar7;
    local_2f8 = GrcSymbolTableEntry::InternalID(pGVar7);
    local_2fc = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_328,"*skipPasses2*",&local_329);
    pGVar7 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)
                        CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                        in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    local_308 = pGVar7;
    if (pGVar7 != (Symbol)0x0) {
      local_2fc = GrcSymbolTableEntry::InternalID(pGVar7);
    }
    this_00 = (GrcManager *)GdlRenderer::NumberOfPasses(in_stack_fffffffffffffaa0);
    this_02 = *(GrcManager **)(in_RDI + 0x90);
    paVar14 = &local_379;
    local_338 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,"justify",paVar14);
    paVar13 = &local_3a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"stretch",paVar13);
    GrcStructName::GrcStructName
              ((GrcStructName *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffa90);
    pGVar7 = GrcSymbolTable::FindSymbol
                       ((GrcSymbolTable *)
                        CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                        in_stack_fffffffffffffad0);
    GrcStructName::~GrcStructName((GrcStructName *)0x11bf50);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    local_340 = pGVar7;
    local_3a8 = GrcSymbolTableEntry::InternalID(pGVar7);
    bVar3 = GrcErrorList::AnyFatalErrors(&g_errorList);
    if (bVar3) {
      std::operator<<(&local_248,"Fatal errors--compilation aborted");
    }
    else {
      std::operator<<(&local_248,"GLYPH ATTRIBUTE IDS\n\n");
      for (local_3b0 = 0; uVar1 = local_3b0,
          sVar8 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                            ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                              *)(in_RDI + 0x1f0)), uVar1 < sVar8; local_3b0 = local_3b0 + 1) {
        ppGVar9 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::
                  operator[]((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                              *)(in_RDI + 0x1f0),local_3b0);
        iVar5 = GrcSymbolTableEntry::InternalID(*ppGVar9);
        if (iVar5 == (int)local_3b0) {
          poVar10 = (ostream *)std::ostream::operator<<(&local_248,local_3b0);
          poVar10 = std::operator<<(poVar10,": ");
          std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                    ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)
                     (in_RDI + 0x1f0),local_3b0);
          GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_fffffffffffffab8);
          poVar10 = std::operator<<(poVar10,local_3d0);
          std::operator<<(poVar10,"\n");
          std::__cxx11::string::~string(local_3d0);
        }
      }
      std::operator<<(&local_248,"\n\n\nGLYPH ATTRIBUTE VALUES\n\n");
      for (local_3d4 = 0; (ulong)local_3d4 < *(ulong *)(in_RDI + 0x168); local_3d4 = local_3d4 + 1)
      {
        ConvertBwForVersion(this_02,(gid16)((ulong)paVar13 >> 0x30),(int)paVar13);
        SplitLargeStretchValue(this_00,(gid16)((ulong)paVar14 >> 0x30),(int)paVar14);
        local_3d5 = 0;
        local_3dc = 0;
        while( true ) {
          this_01 = (GrcSymbolTableEntry *)(ulong)local_3dc;
          pGVar11 = (GrcSymbolTableEntry *)
                    std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::size
                              ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                *)(in_RDI + 0x1f0));
          if (pGVar11 <= this_01) break;
          local_3e0 = FinalAttrValue(in_stack_fffffffffffffa88,
                                     CONCAT11(in_stack_fffffffffffffa87,in_stack_fffffffffffffa86),
                                     in_stack_fffffffffffffa80);
          if (local_3e0 != 0) {
            if ((local_3d5 & 1) == 0) {
              poVar10 = (ostream *)std::ostream::operator<<(&local_248,local_3d4);
              std::operator<<(poVar10,"  [");
              DebugHex((ostream *)
                       CONCAT17(in_stack_fffffffffffffa87,
                                CONCAT16(in_stack_fffffffffffffa86,
                                         CONCAT15(in_stack_fffffffffffffa85,
                                                  CONCAT14(in_stack_fffffffffffffa84,
                                                           in_stack_fffffffffffffa80)))),
                       (gid16)((ulong)in_stack_fffffffffffffa78 >> 0x30));
              std::operator<<(&local_248,"]\n");
            }
            local_3d5 = 1;
            poVar10 = std::operator<<(&local_248,"   ");
            std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::operator[]
                      ((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_> *)
                       (in_RDI + 0x1f0),(ulong)local_3dc);
            GrcSymbolTableEntry::FullName_abi_cxx11_(this_01);
            poVar10 = std::operator<<(poVar10,local_400);
            std::operator<<(poVar10," = ");
            std::__cxx11::string::~string(local_400);
            ppGVar9 = std::vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>::
                      operator[]((vector<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                  *)(in_RDI + 0x1f0),(ulong)local_3dc);
            in_stack_fffffffffffffa88 = (GrcManager *)*ppGVar9;
            paVar12 = &local_421;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_420,"gpoint",paVar12);
            in_stack_fffffffffffffa87 =
                 GrcSymbolTableEntry::LastFieldIs
                           (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
            in_stack_fffffffffffffa85 = (bool)in_stack_fffffffffffffa87 && local_3e0 == 0xfffffffe;
            in_stack_fffffffffffffa86 = in_stack_fffffffffffffa85;
            std::__cxx11::string::~string(local_420);
            std::allocator<char>::~allocator((allocator<char> *)&local_421);
            if ((in_stack_fffffffffffffa85 & 1) == 0) {
              std::ostream::operator<<(&local_248,local_3e0);
              if ((local_3dc == local_2f8) || (local_3dc == local_2fc)) {
                local_430 = (GrcManager *)0x0;
                local_438 = local_338;
                if ((GrcManager *)0x10 < local_338) {
                  local_438 = (GrcManager *)0x10;
                }
                if (local_3dc == local_2fc) {
                  local_430 = (GrcManager *)0x10;
                  local_438 = local_338;
                }
                std::operator<<(&local_248," [");
                DebugHex((ostream *)
                         CONCAT17(in_stack_fffffffffffffa87,
                                  CONCAT16(in_stack_fffffffffffffa86,
                                           CONCAT15(in_stack_fffffffffffffa85,
                                                    CONCAT14(in_stack_fffffffffffffa84,
                                                             in_stack_fffffffffffffa80)))),
                         (gid16)((ulong)in_stack_fffffffffffffa78 >> 0x30));
                std::operator<<(&local_248,"  / ");
                local_43c = local_3e0;
                for (local_448 = local_430; local_448 < local_438;
                    local_448 = (GrcManager *)((long)&local_448->m_fxdSilfTableVersion + 1)) {
                  in_stack_fffffffffffffa70 = (GrcSymbolTableEntry *)std::operator<<(&local_248," ")
                  ;
                  std::ostream::operator<<(in_stack_fffffffffffffa70,local_43c & 1);
                  local_43c = (int)local_43c >> 1;
                }
                std::operator<<(&local_248,"]");
              }
              else if ((9 < (int)local_3e0) || ((int)local_3e0 < 0)) {
                std::operator<<(&local_248," [");
                DebugHex((ostream *)
                         CONCAT17(in_stack_fffffffffffffa87,
                                  CONCAT16(in_stack_fffffffffffffa86,
                                           CONCAT15(in_stack_fffffffffffffa85,
                                                    CONCAT14(in_stack_fffffffffffffa84,
                                                             in_stack_fffffffffffffa80)))),
                         (gid16)((ulong)in_stack_fffffffffffffa78 >> 0x30));
                std::operator<<(&local_248,"]");
              }
              std::operator<<(&local_248,"\n");
            }
            else {
              in_stack_fffffffffffffa78 = std::operator<<(&local_248,"zero");
              std::operator<<(in_stack_fffffffffffffa78,"\n");
            }
          }
          local_3dc = local_3dc + 1;
        }
        if ((local_3d5 & 1) != 0) {
          std::operator<<(&local_248,"\n\n");
        }
      }
    }
    std::ofstream::close();
    local_298 = 0;
  }
  else {
    std::allocator<char>::allocator();
    iVar5 = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
    std::__cxx11::string::string(local_268,"Error in writing to file ",&local_269);
    pcVar6 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,pcVar6,&local_291);
    GrcErrorList::AddWarning
              (in_stack_fffffffffffffac0,iVar5,
               (GdlObject *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffaa8,(string *)in_stack_fffffffffffffaa0);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    local_298 = 1;
  }
  std::ofstream::~ofstream(&local_248);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void GrcManager::DebugGlyphAttributes(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_glyphattrs.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6503, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	int nAttrIdBw = psymBw->InternalID();

	Symbol psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
	int nAttrIdSkipP = psymSkipP->InternalID();
	int nAttrIdSkipP2 = 0;
	Symbol psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
	if (psymSkipP2)
		nAttrIdSkipP2 = psymSkipP2->InternalID();
	auto cpass = this->m_prndr->NumberOfPasses();

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		strmOut << "GLYPH ATTRIBUTE IDS\n\n";
		for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			if (m_vpsymGlyphAttrs[nAttrID]->InternalID() == static_cast<int>(nAttrID))
			{
				strmOut << nAttrID << ": "
					<< m_vpsymGlyphAttrs[nAttrID]->FullName() << "\n";
			}
			// else we have something like justify.stretch which is unused
		}
		strmOut << "\n\n\nGLYPH ATTRIBUTE VALUES\n\n";

		for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
		{
			// Convert breakweight values depending on the table version to output.
			ConvertBwForVersion(wGlyphID, nAttrIdBw);

			//	Split any large stretch values into two 16-bit words.
			SplitLargeStretchValue(wGlyphID, nAttrIdJStr);
		
			bool fAnyNonZero = false;

			for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
			{
				int nValue = FinalAttrValue(wGlyphID, nAttrID);

				//	Skip undefined and zero-valued attributes.
				if (nValue == 0)
					continue;

				if (fAnyNonZero == false)
				{
					strmOut << wGlyphID << "  [";
					DebugHex(strmOut, wGlyphID);
					strmOut << "]\n";
				}

				fAnyNonZero = true;

				strmOut << "   " << m_vpsymGlyphAttrs[nAttrID]->FullName()
					<< " = ";
				if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") &&
					nValue == kGpointZero)
				{
					strmOut << "zero" << "\n";
				}
				else
				{
					strmOut  << nValue;
					if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
					{
						size_t iStart = 0, 
							   iStop = cpass;
						if (cpass > kPassPerSPbitmap)
							iStop = kPassPerSPbitmap;
						if (nAttrID == nAttrIdSkipP2)
						{
							iStart = kPassPerSPbitmap;
							iStop = cpass;
						}

						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "  / ";
						// Print out bits in order of passes (low to high).
						int tValue = nValue;
						for (auto ipass = iStart; ipass < iStop; ++ipass)
						{
							int n = int((tValue & 0x0001) != 0);
							strmOut << " " << n;
							tValue = tValue >> 1;
						}
						strmOut << "]";
					}
					else if (nValue > 9 || nValue < 0)
					{
						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "]";
					}
					strmOut << "\n";
				}
			}

			if (fAnyNonZero)
				strmOut << "\n\n";
		}
	}

	strmOut.close();
}